

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O1

void nn_xrespondent_rm(nn_sockbase *self,nn_pipe *pipe)

{
  void *ptr;
  
  ptr = nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)&self[2].sock,(nn_fq_data *)((long)ptr + 0x20));
  nn_hash_erase((nn_hash *)&self[1].sock,(nn_hash_item *)((long)ptr + 8));
  nn_hash_item_term((nn_hash_item *)((long)ptr + 8));
  nn_free(ptr);
  return;
}

Assistant:

void nn_xrespondent_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xrespondent->inpipes, &data->initem);
    nn_hash_erase (&xrespondent->outpipes, &data->outitem);
    nn_hash_item_term (&data->outitem);

    nn_free (data);
}